

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O2

EnumValue * __thiscall
google::protobuf::util::converter::FindEnumValueByNameOrNull
          (converter *this,Enum *enum_type,StringPiece enum_name)

{
  bool bVar1;
  EnumValue *pEVar2;
  int i;
  int index;
  StringPiece y;
  StringPiece local_48;
  char *local_38;
  
  local_38 = enum_name.ptr_;
  pEVar2 = (EnumValue *)0x0;
  if (this != (converter *)0x0) {
    index = 0;
    do {
      if (*(int *)(this + 0x18) <= index) {
        return (EnumValue *)0x0;
      }
      pEVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValue>::TypeHandler>
                         ((RepeatedPtrFieldBase *)(this + 0x10),index);
      StringPiece::StringPiece<std::allocator<char>>(&local_48,(pEVar2->name_).ptr_);
      y.length_ = (stringpiece_ssize_type)local_38;
      y.ptr_ = (char *)enum_type;
      bVar1 = operator==(local_48,y);
      index = index + 1;
    } while (!bVar1);
  }
  return pEVar2;
}

Assistant:

const google::protobuf::EnumValue* FindEnumValueByNameOrNull(
    const google::protobuf::Enum* enum_type, StringPiece enum_name) {
  if (enum_type != nullptr) {
    for (int i = 0; i < enum_type->enumvalue_size(); ++i) {
      const google::protobuf::EnumValue& enum_value = enum_type->enumvalue(i);
      if (enum_value.name() == enum_name) {
        return &enum_value;
      }
    }
  }
  return nullptr;
}